

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

string * __thiscall
BCLog::LogEscapeMessage_abi_cxx11_(string *__return_storage_ptr__,BCLog *this,string_view str)

{
  BCLog *pBVar1;
  long in_FS_OFFSET;
  uint8_t ch;
  BCLog local_59;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (pBVar1 = (BCLog *)0x0; this != pBVar1; pBVar1 = pBVar1 + 1) {
    local_59 = pBVar1[str._M_len];
    if ((local_59 == (BCLog)0x7f) || ((byte)local_59 < 0x20 && local_59 != (BCLog)0xa)) {
      tinyformat::format<unsigned_char>(&local_58,"\\x%02x",(uchar *)&local_59);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(char)local_59);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string LogEscapeMessage(std::string_view str) {
        std::string ret;
        for (char ch_in : str) {
            uint8_t ch = (uint8_t)ch_in;
            if ((ch >= 32 || ch == '\n') && ch != '\x7f') {
                ret += ch_in;
            } else {
                ret += strprintf("\\x%02x", ch);
            }
        }
        return ret;
    }